

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O0

void __thiscall randomx::Instruction::h_IADD_RS(Instruction *this,ostream *os)

{
  byte bVar1;
  uint32_t uVar2;
  int iVar3;
  ostream *poVar4;
  void *this_00;
  uint uVar5;
  ostream *in_RSI;
  Instruction *in_RDI;
  int srcIndex;
  int dstIndex;
  
  uVar5 = (uint)in_RDI->dst % 8;
  bVar1 = in_RDI->src;
  poVar4 = std::operator<<(in_RSI,"r");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,uVar5);
  poVar4 = std::operator<<(poVar4,", r");
  std::ostream::operator<<(poVar4,(uint)bVar1 % 8);
  if (uVar5 == 5) {
    poVar4 = std::operator<<(in_RSI,", ");
    uVar2 = getImm32((Instruction *)0x10ff4c);
    std::ostream::operator<<(poVar4,uVar2);
  }
  poVar4 = std::operator<<(in_RSI,", SHFT ");
  iVar3 = getModShift(in_RDI);
  this_00 = (void *)std::ostream::operator<<(poVar4,iVar3);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void Instruction::h_IADD_RS(std::ostream& os) const {
		auto dstIndex = dst % RegistersCount;
		auto srcIndex = src % RegistersCount;
		os << "r" << dstIndex << ", r" << srcIndex;
		if(dstIndex == RegisterNeedsDisplacement) {
			os << ", " << (int32_t)getImm32();
		}
		os << ", SHFT " << getModShift() << std::endl;
	}